

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O0

Flow * __thiscall
wasm::PrecomputingExpressionRunner::visitStringNew
          (Flow *__return_storage_ptr__,PrecomputingExpressionRunner *this,StringNew *curr)

{
  Name breakTo;
  Name breakTo_00;
  bool bVar1;
  HeapType local_50;
  int local_44;
  HeapType local_40;
  HeapType heapType;
  Type refType;
  StringNew *curr_local;
  PrecomputingExpressionRunner *this_local;
  
  if (curr->op == StringNewWTF16Array) {
    heapType.id = (curr->ref->type).id;
    bVar1 = wasm::Type::isRef((Type *)&heapType);
    if (bVar1) {
      local_40 = wasm::Type::getHeapType((Type *)&heapType);
      bVar1 = HeapType::isArray(&local_40);
      if ((bVar1) && (HeapType::getArray(&local_50), local_44 == 0)) {
        ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringNew
                  (__return_storage_ptr__,
                   (ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,curr);
        return __return_storage_ptr__;
      }
    }
    breakTo.super_IString.str._M_str = DAT_03194068;
    breakTo.super_IString.str._M_len = NONCONSTANT_FLOW;
    Flow::Flow(__return_storage_ptr__,breakTo);
  }
  else {
    breakTo_00.super_IString.str._M_str = DAT_03194068;
    breakTo_00.super_IString.str._M_len = NONCONSTANT_FLOW;
    Flow::Flow(__return_storage_ptr__,breakTo_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringNew(StringNew* curr) {
    if (curr->op != StringNewWTF16Array) {
      // TODO: handle other string ops. For now we focus on JS-like strings.
      return Flow(NONCONSTANT_FLOW);
    }

    // string.encode_wtf16_array is effectively an Array read operation, so
    // just like ArrayGet above we must check for immutability.
    auto refType = curr->ref->type;
    if (refType.isRef()) {
      auto heapType = refType.getHeapType();
      if (heapType.isArray()) {
        if (heapType.getArray().element.mutable_ == Immutable) {
          return Super::visitStringNew(curr);
        }
      }
    }

    // Otherwise, this is mutable or unreachable or otherwise uninteresting.
    return Flow(NONCONSTANT_FLOW);
  }